

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O3

bool anon_unknown.dwarf_388d::test_derivative_random
               (string *str,string *derivative_str,uint32_t var_id,double xmin,double xmax)

{
  uint uVar1;
  ostream *poVar2;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Expr diff;
  Expr expect;
  Expr expr;
  Expr local_78;
  Expr local_60;
  Expr local_48;
  
  nivalis::parse(&local_48,str,(Environment *)&(anonymous_namespace)::env,true,false,0,(string *)0x0
                );
  nivalis::parse(&local_60,derivative_str,(Environment *)&(anonymous_namespace)::env,true,false,0,
                 (string *)0x0);
  iVar4 = 0;
  nivalis::Expr::diff(&local_78,&local_48,0,(Environment *)&(anonymous_namespace)::env);
  iVar3 = 1000;
  do {
    dVar5 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &nivalis::test::(anonymous_namespace)::reng);
    *(anonymous_namespace)::env = dVar5 * (xmax - xmin) + xmin;
    dVar5 = nivalis::Expr::operator()(&local_78,(Environment *)&(anonymous_namespace)::env);
    dVar6 = nivalis::Expr::operator()(&local_60,(Environment *)&(anonymous_namespace)::env);
    if ((!NAN(dVar5)) || (uVar1 = 1, !NAN(dVar6))) {
      dVar7 = ABS(dVar5 - dVar6);
      dVar5 = ABS((dVar5 - dVar6) / dVar5);
      if (dVar7 <= dVar5) {
        dVar5 = dVar7;
      }
      uVar1 = (uint)(dVar5 < 1e-06);
    }
    iVar4 = iVar4 + uVar1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (iVar4 != 1000) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Derivative equiv test fail\ndiff   ",0x22);
    poVar2 = nivalis::operator<<((ostream *)&std::cerr,&local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nexpect ",8);
    poVar2 = nivalis::operator<<(poVar2,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (local_78.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar4 == 1000;
}

Assistant:

bool test_derivative_random(
            const std::string& str,
            const std::string& derivative_str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        Expr expr = parse(str, env);
        Expr expect = parse(derivative_str, env);
        Expr diff = expr.diff(var_id, env);
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double dfx = diff(env);
            double dfx_expect = expect(env);
            if (std::isnan(dfx) && std::isnan(dfx_expect)) ++cnt;
            else cnt += (absrelerr(dfx, dfx_expect) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Derivative equiv test fail\ndiff   " << diff <<
                "\nexpect " << expect << "\n";
            return false;
        }
        return true;
    }